

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::MockCodeGenerator::Generate
          (MockCodeGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FeatureSet *pFVar1;
  ushort *puVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Edition EVar8;
  ConstType pTVar9;
  Descriptor *pDVar10;
  EnumDescriptor *this_00;
  FieldDescriptor *pFVar11;
  ServiceDescriptor *this_01;
  MethodDescriptor *pMVar12;
  size_t sVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>_>
  *pVVar14;
  ZeroCopyOutputStream *pZVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ZeroCopyOutputStream *output;
  LogMessage *pLVar16;
  ostream *poVar17;
  Nonnull<std::string_*> pbVar18;
  ulong uVar19;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *annotation_collector_00;
  Arena *pAVar20;
  int i;
  uint uVar21;
  int iVar22;
  char *pcVar23;
  int index;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  FieldDescriptor *descriptor_01;
  FileDescriptor *file_00;
  string_view sVar24;
  string_view str;
  string_view text;
  string_view text_00;
  string_view str_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view prefix;
  string_view prefix_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  string_view prefix_01;
  string_view prefix_02;
  string_view prefix_03;
  string_view generator_name;
  string_view generator_name_00;
  string_view generator_name_01;
  string_view generator_name_02;
  string_view generator_name_03;
  string_view generator_name_04;
  string_view generator_name_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  FixedMapping replacements;
  FixedMapping replacements_00;
  string_view text_01;
  string_view varname;
  string_view text_02;
  string_view varname_00;
  string_view text_03;
  string_view varname_01;
  string_view parameter_00;
  string_view parameter_01;
  string_view parameter_02;
  string_view file_name;
  string_view file_name_00;
  string_view file_name_01;
  GeneratorContext *in_stack_fffffffffffffd60;
  string local_278;
  GeneratedCodeInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insert_into;
  long local_200;
  string content;
  Version compiler_version;
  undefined1 local_157;
  undefined1 *local_e0;
  string local_90;
  AlphaNum local_70;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  undefined4 extraout_var;
  undefined4 extraout_var_02;
  
  file_00 = (FileDescriptor *)error;
  sVar24 = anon_unknown_0::GetTestCase();
  __y._M_str = "high_minimum";
  __y._M_len = 0xc;
  bVar5 = std::operator==(sVar24,__y);
  if (bVar5) {
    this->minimum_edition_ = EDITION_99997_TEST_ONLY;
  }
  else {
    __y_00._M_str = "low_maximum";
    __y_00._M_len = 0xb;
    bVar5 = std::operator==(sVar24,__y_00);
    if (bVar5) {
      this->maximum_edition_ = EDITION_PROTO2;
    }
  }
  EVar8 = FileDescriptor::edition(file);
  if ((999 < (int)EVar8) && ((this->suppressed_features_ & 2) == 0)) {
    pFVar1 = file->merged_features_;
    bVar5 = FeatureSet::
            HasExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>>
                      (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                               *)pb::test);
    if (!bVar5) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&compiler_version,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xec,"features.HasExtension(pb::test)");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&compiler_version,
                 (char (*) [41])"Test features were not resolved properly");
LAB_001807b0:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&compiler_version);
    }
    pTVar9 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
    if ((undefined1  [76])((undefined1  [76])pTVar9->field_0 & (undefined1  [76])0x1) ==
        (undefined1  [76])0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&compiler_version,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xee,"features.GetExtension(pb::test).has_file_feature()");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&compiler_version,
                 (char (*) [41])"Test features were not resolved properly");
      goto LAB_001807b0;
    }
    pTVar9 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
    if ((undefined1  [76])((undefined1  [76])pTVar9->field_0 & (undefined1  [76])0x800) ==
        (undefined1  [76])0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&compiler_version,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&compiler_version,
                 (char (*) [41])"Test features were not resolved properly");
      goto LAB_001807b0;
    }
    for (uVar21 = 0; (int)uVar21 < file->message_type_count_; uVar21 = uVar21 + 1) {
      descriptor = (Descriptor *)(ulong)uVar21;
      pDVar10 = FileDescriptor::message_type(file,uVar21);
      internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                 *)pDVar10,descriptor);
    }
    for (uVar21 = 0; (int)uVar21 < file->enum_type_count_; uVar21 = uVar21 + 1) {
      descriptor_00 = (EnumDescriptor *)(ulong)uVar21;
      this_00 = FileDescriptor::enum_type(file,uVar21);
      internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                 *)this_00,descriptor_00);
    }
    for (uVar21 = 0; (int)uVar21 < file->extension_count_; uVar21 = uVar21 + 1) {
      descriptor_01 = (FieldDescriptor *)(ulong)uVar21;
      pFVar11 = FileDescriptor::extension(file,uVar21);
      internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                 *)pFVar11,descriptor_01);
    }
    for (iVar22 = 0; iVar22 < file->service_count_; iVar22 = iVar22 + 1) {
      this_01 = FileDescriptor::service(file,iVar22);
      pFVar1 = this_01->merged_features_;
      bVar5 = FeatureSet::
              HasExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>>
                        (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                 *)pb::test);
      if (!bVar5) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&compiler_version,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0xec,"features.HasExtension(pb::test)");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&compiler_version,
                   (char (*) [41])"Test features were not resolved properly");
        goto LAB_001807b0;
      }
      pTVar9 = FeatureSet::
               GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                         (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                  *)pb::test);
      if ((undefined1  [76])((undefined1  [76])pTVar9->field_0 & (undefined1  [76])0x1) ==
          (undefined1  [76])0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&compiler_version,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0xee,"features.GetExtension(pb::test).has_file_feature()");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&compiler_version,
                   (char (*) [41])"Test features were not resolved properly");
        goto LAB_001807b0;
      }
      pTVar9 = FeatureSet::
               GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                         (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                  *)pb::test);
      if ((undefined1  [76])((undefined1  [76])pTVar9->field_0 & (undefined1  [76])0x800) ==
          (undefined1  [76])0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&compiler_version,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&compiler_version,
                   (char (*) [41])"Test features were not resolved properly");
        goto LAB_001807b0;
      }
      index = 0;
      while (index < this_01->method_count_) {
        pMVar12 = ServiceDescriptor::method(this_01,index);
        pFVar1 = pMVar12->merged_features_;
        bVar5 = FeatureSet::
                HasExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>>
                          (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                   *)pb::test);
        if (!bVar5) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&compiler_version,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xec,"features.HasExtension(pb::test)");
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    ((LogMessage *)&compiler_version,
                     (char (*) [41])"Test features were not resolved properly");
          goto LAB_001807b0;
        }
        pTVar9 = FeatureSet::
                 GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                           (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                    *)pb::test);
        if ((undefined1  [76])((undefined1  [76])pTVar9->field_0 & (undefined1  [76])0x1) ==
            (undefined1  [76])0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&compiler_version,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xee,"features.GetExtension(pb::test).has_file_feature()");
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    ((LogMessage *)&compiler_version,
                     (char (*) [41])"Test features were not resolved properly");
          goto LAB_001807b0;
        }
        pTVar9 = FeatureSet::
                 GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                           (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                    *)pb::test);
        index = index + 1;
        if ((undefined1  [76])((undefined1  [76])pTVar9->field_0 & (undefined1  [76])0x800) ==
            (undefined1  [76])0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&compiler_version,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    ((LogMessage *)&compiler_version,
                     (char (*) [41])"Test features were not resolved properly");
          goto LAB_001807b0;
        }
      }
    }
  }
  local_200 = 8;
  bVar5 = false;
  for (iVar22 = 0; iVar22 < file->message_type_count_; iVar22 = iVar22 + 1) {
    pDVar10 = FileDescriptor::message_type(file,iVar22);
    puVar2 = (ushort *)(pDVar10->all_names_).payload_;
    sVar24._M_len = (ulong)*puVar2;
    sVar24._M_str = (char *)((long)puVar2 + ~sVar24._M_len);
    prefix._M_str = "MockCodeGenerator_";
    prefix._M_len = 0x12;
    bVar6 = absl::lts_20250127::StartsWith(sVar24,prefix);
    if (bVar6) {
      pDVar10 = FileDescriptor::message_type(file,iVar22);
      puVar2 = (ushort *)(pDVar10->all_names_).payload_;
      str._M_len = (ulong)*puVar2;
      str._M_str = (char *)((long)puVar2 + ~str._M_len);
      prefix_00._M_str = "MockCodeGenerator_";
      prefix_00._M_len = 0x12;
      sVar24 = absl::lts_20250127::StripPrefix(str,prefix_00);
      __y_01._M_str = "Error";
      __y_01._M_len = 5;
      bVar5 = std::operator==(sVar24,__y_01);
      if (bVar5) {
        std::__cxx11::string::assign((char *)error);
        return false;
      }
      __y_02._M_str = "Exit";
      __y_02._M_len = 4;
      bVar5 = std::operator==(sVar24,__y_02);
      if (bVar5) {
        poVar17 = std::operator<<((ostream *)&std::cerr,"Saw message type MockCodeGenerator_Exit.");
        std::endl<char,std::char_traits<char>>(poVar17);
        exit(0x7b);
      }
      __y_03._M_str = "Abort";
      __y_03._M_len = 5;
      bVar5 = std::operator!=(sVar24,__y_03);
      if (!bVar5) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&compiler_version,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x102,"command != \"Abort\"");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&compiler_version,
                   (char (*) [42])"Saw message type MockCodeGenerator_Abort.");
        goto LAB_001807b0;
      }
      __y_04._M_str = "HasSourceCodeInfo";
      __y_04._M_len = 0x11;
      bVar5 = std::operator==(sVar24,__y_04);
      if (bVar5) {
        FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&compiler_version);
        FileDescriptor::CopySourceCodeInfoTo(file,(FileDescriptorProto *)&compiler_version);
        bVar5 = FileDescriptorProto::has_source_code_info((FileDescriptorProto *)&compiler_version);
        if (bVar5) {
          if ((SourceCodeInfo *)local_e0 == (SourceCodeInfo *)0x0) {
            local_e0 = _SourceCodeInfo_default_instance_;
          }
          bVar5 = 0 < *(int *)((long)&((SourceCodeInfo *)local_e0)->field_0 + 0x20);
        }
        else {
          bVar5 = false;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&info,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x10a);
        pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            ((LogMessage *)&info,
                             (char (*) [55])"Saw message type MockCodeGenerator_HasSourceCodeInfo: "
                            );
        pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar16,bVar5);
        absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar16,(char (*) [2])0x3b285f);
LAB_001806ce:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&info);
      }
      __y_05._M_str = "HasJsonName";
      __y_05._M_len = 0xb;
      bVar5 = std::operator==(sVar24,__y_05);
      if (bVar5) {
        FieldDescriptorProto::FieldDescriptorProto((FieldDescriptorProto *)&compiler_version);
        pDVar10 = FileDescriptor::message_type(file,iVar22);
        pFVar11 = Descriptor::field(pDVar10,0);
        FieldDescriptor::CopyTo(pFVar11,(FieldDescriptorProto *)&compiler_version);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&info,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x110);
        pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            ((LogMessage *)&info,(char (*) [16])"Saw json_name: ");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (pLVar16,SUB41(((uint)compiler_version.field_0._impl_._has_bits_.has_bits_[0] &
                                 0x10) >> 4,0));
        goto LAB_001806ce;
      }
      __y_06._M_str = "Annotate";
      __y_06._M_len = 8;
      bVar6 = std::operator==(sVar24,__y_06);
      bVar5 = true;
      if (!bVar6) {
        __y_07._M_str = "ShowVersionNumber";
        __y_07._M_len = 0x11;
        bVar5 = std::operator==(sVar24,__y_07);
        if (bVar5) {
          Version::Version(&compiler_version);
          (*context->_vptr_GeneratorContext[7])(context,&compiler_version);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&info,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0x117);
          pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              ((LogMessage *)&info,(char (*) [23])"Saw compiler_version: ");
          pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              (pLVar16,compiler_version.field_0._impl_.minor_ * 1000 +
                                       compiler_version.field_0._impl_.major_ * 1000000 +
                                       compiler_version.field_0._impl_.patch_);
          pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              (pLVar16,(char (*) [2])0x44c6fd);
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    (pLVar16,(string *)
                             ((ulong)compiler_version.field_0._impl_.suffix_.tagged_ptr_.ptr_ &
                             0xfffffffffffffffc));
          goto LAB_001806ce;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&compiler_version,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x11d);
        pLVar16 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            ((LogMessage *)&compiler_version,
                             (char (*) [36])"Unknown MockCodeGenerator command: ");
        absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar16,sVar24);
        goto LAB_001807b0;
      }
    }
  }
  pcVar23 = "insert_endlines=";
  text._M_str = (parameter->_M_dataplus)._M_p;
  text._M_len = parameter->_M_string_length;
  prefix_01._M_str = "insert_endlines=";
  prefix_01._M_len = 0x10;
  bVar6 = absl::lts_20250127::StartsWith(text,prefix_01);
  if (bVar6) {
LAB_0017f8ea:
    pcVar3 = (parameter->_M_dataplus)._M_p;
    sVar4 = parameter->_M_string_length;
    sVar13 = strlen(pcVar23);
    str_00._M_str = pcVar3;
    str_00._M_len = sVar4;
    prefix_03._M_str = pcVar23;
    prefix_03._M_len = sVar13;
    compiler_version.super_Message.super_MessageLite =
         (MessageLite)absl::lts_20250127::StripPrefix(str_00,prefix_03);
    compiler_version.field_0._impl_._has_bits_.has_bits_[0]._0_1_ = 0x2c;
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              (&insert_into,
               (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)&compiler_version);
    uVar19 = 0;
    while( true ) {
      if ((ulong)((long)insert_into.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)insert_into.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&insert_into);
        return true;
      }
      GeneratedCodeInfo::GeneratedCodeInfo(&info);
      pbVar18 = (Nonnull<std::string_*>)0xc;
      generator_name._M_str = (char *)0xc;
      generator_name._M_len = (size_t)(this->name_)._M_dataplus._M_p;
      parameter_00._M_str = (char *)file;
      parameter_00._M_len = (size_t)"first_insert";
      pcVar23 = "first_insert";
      GetOutputFileContent_abi_cxx11_
                (&content,(MockCodeGenerator *)(this->name_)._M_string_length,generator_name,
                 parameter_00,(FileDescriptor *)context,in_stack_fffffffffffffd60);
      if (bVar6) {
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&compiler_version,(char (*) [2])0x457636,(char (*) [3])0x44d237);
        replacements._M_len = (size_type)&content;
        replacements._M_array = (iterator)0x1;
        absl::lts_20250127::StrReplaceAll((lts_20250127 *)&compiler_version,replacements,pbVar18);
      }
      if (bVar5) {
        pVVar14 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                            ((RepeatedPtrFieldBase *)&info.field_0._impl_);
        (pVVar14->field_0)._impl_.begin_ = 0;
        (pVVar14->field_0)._impl_.end_ = (int32_t)content._M_string_length;
        (pVVar14->field_0)._impl_._has_bits_.has_bits_[0] =
             (pVVar14->field_0)._impl_._has_bits_.has_bits_[0] | 7;
        pAVar20 = (Arena *)(pVVar14->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar20 & 1) != 0) {
          pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set(&(pVVar14->field_0)._impl_.source_file_,"first_path",pAVar20);
      }
      generator_name_00._M_str = (char *)file;
      generator_name_00._M_len =
           *(size_t *)
            ((long)insert_into.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_200 + -8);
      GetOutputFileName_abi_cxx11_
                ((string *)&compiler_version,
                 *(MockCodeGenerator **)
                  ((long)&((insert_into.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                  local_200),generator_name_00,(FileDescriptor *)pcVar23);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_70,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 compiler::(anonymous_namespace)::kFirstInsertionPointName,
                 (allocator<char> *)&local_278);
      iVar22 = (*context->_vptr_GeneratorContext[5])(context,(Printer *)&compiler_version,&local_70)
      ;
      pZVar15 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar22);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&compiler_version);
      io::Printer::Printer((Printer *)&compiler_version,pZVar15,'$',(AnnotationCollector *)0x0);
      io::Printer::WriteRaw
                ((Printer *)&compiler_version,content._M_dataplus._M_p,content._M_string_length);
      if ((bool)local_157 == true) break;
      io::Printer::~Printer((Printer *)&compiler_version);
      if (pZVar15 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar15->_vptr_ZeroCopyOutputStream[1])(pZVar15);
      }
      std::__cxx11::string::~string((string *)&content);
      GeneratedCodeInfo::~GeneratedCodeInfo(&info);
      GeneratedCodeInfo::GeneratedCodeInfo(&info);
      pbVar18 = (Nonnull<std::string_*>)0xd;
      generator_name_01._M_str = (char *)0xd;
      generator_name_01._M_len = (size_t)(this->name_)._M_dataplus._M_p;
      parameter_01._M_str = (char *)file;
      parameter_01._M_len = (size_t)"second_insert";
      pcVar23 = "second_insert";
      GetOutputFileContent_abi_cxx11_
                (&content,(MockCodeGenerator *)(this->name_)._M_string_length,generator_name_01,
                 parameter_01,(FileDescriptor *)context,in_stack_fffffffffffffd60);
      if (bVar6) {
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&compiler_version,(char (*) [2])0x457636,(char (*) [3])0x44d237);
        replacements_00._M_len = (size_type)&content;
        replacements_00._M_array = (iterator)0x1;
        absl::lts_20250127::StrReplaceAll((lts_20250127 *)&compiler_version,replacements_00,pbVar18)
        ;
      }
      if (bVar5) {
        pVVar14 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                            ((RepeatedPtrFieldBase *)&info.field_0._impl_);
        (pVVar14->field_0)._impl_.begin_ = 0;
        (pVVar14->field_0)._impl_.end_ = (int32_t)content._M_string_length;
        (pVVar14->field_0)._impl_._has_bits_.has_bits_[0] =
             (pVVar14->field_0)._impl_._has_bits_.has_bits_[0] | 7;
        pAVar20 = (Arena *)(pVVar14->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar20 & 1) != 0) {
          pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set(&(pVVar14->field_0)._impl_.source_file_,"second_path",pAVar20)
        ;
      }
      generator_name_02._M_str = (char *)file;
      generator_name_02._M_len =
           *(size_t *)
            ((long)insert_into.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_200 + -8);
      GetOutputFileName_abi_cxx11_
                ((string *)&compiler_version,
                 *(MockCodeGenerator **)
                  ((long)&((insert_into.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                  local_200),generator_name_02,(FileDescriptor *)pcVar23);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_70,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 compiler::(anonymous_namespace)::kSecondInsertionPointName,
                 (allocator<char> *)&local_278);
      iVar22 = (*context->_vptr_GeneratorContext[5])(context,(Printer *)&compiler_version,&local_70)
      ;
      pZVar15 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar22);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&compiler_version);
      io::Printer::Printer((Printer *)&compiler_version,pZVar15,'$',(AnnotationCollector *)0x0);
      io::Printer::WriteRaw
                ((Printer *)&compiler_version,content._M_dataplus._M_p,content._M_string_length);
      if ((bool)local_157 == true) {
        std::__cxx11::string::assign((char *)error);
        goto LAB_00180093;
      }
      io::Printer::~Printer((Printer *)&compiler_version);
      if (pZVar15 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar15->_vptr_ZeroCopyOutputStream[1])(pZVar15);
      }
      std::__cxx11::string::~string((string *)&content);
      GeneratedCodeInfo::~GeneratedCodeInfo(&info);
      uVar19 = uVar19 + 1;
      local_200 = local_200 + 0x20;
    }
    std::__cxx11::string::assign((char *)error);
LAB_00180093:
    io::Printer::~Printer((Printer *)&compiler_version);
    if (pZVar15 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar15->_vptr_ZeroCopyOutputStream[1])(pZVar15);
    }
    std::__cxx11::string::~string((string *)&content);
    GeneratedCodeInfo::~GeneratedCodeInfo(&info);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&insert_into);
    return false;
  }
  pcVar23 = "insert=";
  text_00._M_str = (parameter->_M_dataplus)._M_p;
  text_00._M_len = parameter->_M_string_length;
  prefix_02._M_str = "insert=";
  prefix_02._M_len = 7;
  bVar7 = absl::lts_20250127::StartsWith(text_00,prefix_02);
  if (bVar7) goto LAB_0017f8ea;
  generator_name_03._M_str = (char *)file;
  generator_name_03._M_len = (size_t)(this->name_)._M_dataplus._M_p;
  GetOutputFileName_abi_cxx11_
            ((string *)&compiler_version,(MockCodeGenerator *)(this->name_)._M_string_length,
             generator_name_03,file_00);
  iVar22 = (*context->_vptr_GeneratorContext[2])(context,&compiler_version);
  pZVar15 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar22);
  std::__cxx11::string::~string((string *)&compiler_version);
  GeneratedCodeInfo::GeneratedCodeInfo(&info);
  annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
       (_func_int **)&PTR__AnnotationCollector_0053c928;
  annotation_collector_00 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
  if (bVar5) {
    annotation_collector_00 = &annotation_collector;
  }
  annotation_collector.annotation_proto_ = &info;
  io::Printer::Printer
            ((Printer *)&compiler_version,pZVar15,'$',
             &annotation_collector_00->super_AnnotationCollector);
  generator_name_04._M_str = (char *)parameter->_M_string_length;
  generator_name_04._M_len = (size_t)(this->name_)._M_dataplus._M_p;
  parameter_02._M_str = (char *)file;
  parameter_02._M_len = (size_t)(parameter->_M_dataplus)._M_p;
  GetOutputFileContent_abi_cxx11_
            (&content,(MockCodeGenerator *)(this->name_)._M_string_length,generator_name_04,
             parameter_02,(FileDescriptor *)context,in_stack_fffffffffffffd60);
  io::Printer::WriteRaw
            ((Printer *)&compiler_version,content._M_dataplus._M_p,content._M_string_length);
  std::__cxx11::string::~string((string *)&content);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&insert_into,"_annotation",(allocator<char> *)&content);
  if (bVar5) {
    text_01._M_str = "$p$\n";
    text_01._M_len = 4;
    io::Printer::Print<char[2],char[6]>
              ((Printer *)&compiler_version,text_01,(char (*) [2])0x449d04,(char (*) [6])0x37c7cc);
    content._0_16_ = absl::lts_20250127::NullSafeStringView("first");
    local_70.piece_._M_str =
         (char *)insert_into.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_70.piece_._M_len =
         (size_t)insert_into.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_278,(lts_20250127 *)&content,&local_70,
               (AlphaNum *)
               insert_into.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    varname._M_str = "p";
    varname._M_len = 1;
    file_name._M_str = local_278._M_dataplus._M_p;
    file_name._M_len = local_278._M_string_length;
    io::Printer::Annotate
              ((Printer *)&compiler_version,varname,file_name,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    std::__cxx11::string::~string((string *)&local_278);
  }
  io::Printer::WriteRaw
            ((Printer *)&compiler_version,
             "# @@protoc_insertion_point(first_mock_insertion_point) is here\n",0x3f);
  if (bVar5) {
    text_02._M_str = "$p$\n";
    text_02._M_len = 4;
    io::Printer::Print<char[2],char[7]>
              ((Printer *)&compiler_version,text_02,(char (*) [2])0x449d04,(char (*) [7])0x37c7a2);
    content._0_16_ = absl::lts_20250127::NullSafeStringView("second");
    local_70.piece_._M_str =
         (char *)insert_into.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_70.piece_._M_len =
         (size_t)insert_into.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_278,(lts_20250127 *)&content,&local_70,
               (AlphaNum *)
               insert_into.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    varname_00._M_str = "p";
    varname_00._M_len = 1;
    file_name_00._M_str = local_278._M_dataplus._M_p;
    file_name_00._M_len = local_278._M_string_length;
    io::Printer::Annotate
              ((Printer *)&compiler_version,varname_00,file_name_00,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    std::__cxx11::string::~string((string *)&local_278);
  }
  io::Printer::WriteRaw
            ((Printer *)&compiler_version,
             "  # @@protoc_insertion_point(second_mock_insertion_point) is here\n",0x42);
  if (bVar5) {
    text_03._M_str = "$p$\n";
    text_03._M_len = 4;
    io::Printer::Print<char[2],char[6]>
              ((Printer *)&compiler_version,text_03,(char (*) [2])0x449d04,(char (*) [6])"third");
    content._0_16_ = absl::lts_20250127::NullSafeStringView("third");
    local_70.piece_._M_str =
         (char *)insert_into.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_70.piece_._M_len =
         (size_t)insert_into.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_278,(lts_20250127 *)&content,&local_70,
               (AlphaNum *)
               insert_into.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    varname_01._M_str = "p";
    varname_01._M_len = 1;
    file_name_01._M_str = local_278._M_dataplus._M_p;
    file_name_01._M_len = local_278._M_string_length;
    io::Printer::Annotate
              ((Printer *)&compiler_version,varname_01,file_name_01,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    std::__cxx11::string::~string((string *)&local_278);
    if ((bool)local_157 == false) {
      generator_name_05._M_str = (char *)file;
      generator_name_05._M_len = (size_t)(this->name_)._M_dataplus._M_p;
      GetOutputFileName_abi_cxx11_
                (&local_90,(MockCodeGenerator *)(this->name_)._M_string_length,generator_name_05,
                 (FileDescriptor *)local_278._M_dataplus._M_p);
      content._M_string_length = (size_type)local_90._M_dataplus._M_p;
      content._M_dataplus._M_p = (pointer)local_90._M_string_length;
      local_70.piece_ = absl::lts_20250127::NullSafeStringView(".pb.meta");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_278,(lts_20250127 *)&content,&local_70,&local_70)
      ;
      iVar22 = (*context->_vptr_GeneratorContext[2])(context,&local_278);
      output = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar22);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_90);
      bVar5 = TextFormat::Print(&info.super_Message,output);
      if (bVar5) {
        if (output != (ZeroCopyOutputStream *)0x0) {
          (*output->_vptr_ZeroCopyOutputStream[1])(output);
        }
        goto LAB_00180139;
      }
      std::__cxx11::string::assign((char *)error);
      if (output != (ZeroCopyOutputStream *)0x0) {
        (*output->_vptr_ZeroCopyOutputStream[1])(output);
      }
      goto LAB_00180104;
    }
  }
  else if ((bool)local_157 != true) {
LAB_00180139:
    std::__cxx11::string::~string((string *)&insert_into);
    io::Printer::~Printer((Printer *)&compiler_version);
    GeneratedCodeInfo::~GeneratedCodeInfo(&info);
    if (pZVar15 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar15->_vptr_ZeroCopyOutputStream[1])(pZVar15);
      return true;
    }
    return true;
  }
  std::__cxx11::string::assign((char *)error);
LAB_00180104:
  std::__cxx11::string::~string((string *)&insert_into);
  io::Printer::~Printer((Printer *)&compiler_version);
  GeneratedCodeInfo::~GeneratedCodeInfo(&info);
  if (pZVar15 == (ZeroCopyOutputStream *)0x0) {
    return false;
  }
  (*pZVar15->_vptr_ZeroCopyOutputStream[1])(pZVar15);
  return false;
}

Assistant:

bool MockCodeGenerator::Generate(const FileDescriptor* file,
                                 const std::string& parameter,
                                 GeneratorContext* context,
                                 std::string* error) const {
  // Override minimum/maximum after generating the pool to simulate a plugin
  // that "works" but doesn't advertise support of the current edition.
  absl::string_view test_case = GetTestCase();
  if (test_case == "high_minimum") {
    minimum_edition_ = Edition::EDITION_99997_TEST_ONLY;
  } else if (test_case == "low_maximum") {
    maximum_edition_ = Edition::EDITION_PROTO2;
  }

  if (GetEdition(*file) >= Edition::EDITION_2023 &&
      (suppressed_features_ & CodeGenerator::FEATURE_SUPPORTS_EDITIONS) == 0) {
    internal::VisitDescriptors(*file, [&](const auto& descriptor) {
      const FeatureSet& features = GetResolvedSourceFeatures(descriptor);
      ABSL_CHECK(features.HasExtension(pb::test))
          << "Test features were not resolved properly";
      ABSL_CHECK(features.GetExtension(pb::test).has_file_feature())
          << "Test features were not resolved properly";
      ABSL_CHECK(features.GetExtension(pb::test).has_source_feature())
          << "Test features were not resolved properly";
    });
  }

  bool annotate = false;
  for (int i = 0; i < file->message_type_count(); i++) {
    if (absl::StartsWith(file->message_type(i)->name(), "MockCodeGenerator_")) {
      absl::string_view command = absl::StripPrefix(
          file->message_type(i)->name(), "MockCodeGenerator_");
      if (command == "Error") {
        *error = "Saw message type MockCodeGenerator_Error.";
        return false;
      }
      if (command == "Exit") {
        std::cerr << "Saw message type MockCodeGenerator_Exit." << std::endl;
        exit(123);
      }
      ABSL_CHECK(command != "Abort")
          << "Saw message type MockCodeGenerator_Abort.";
      if (command == "HasSourceCodeInfo") {
        FileDescriptorProto file_descriptor_proto;
        file->CopySourceCodeInfoTo(&file_descriptor_proto);
        bool has_source_code_info =
            file_descriptor_proto.has_source_code_info() &&
            file_descriptor_proto.source_code_info().location_size() > 0;
        ABSL_LOG(FATAL)
            << "Saw message type MockCodeGenerator_HasSourceCodeInfo: "
            << has_source_code_info << ".";
      } else if (command == "HasJsonName") {
        FieldDescriptorProto field_descriptor_proto;
        file->message_type(i)->field(0)->CopyTo(&field_descriptor_proto);
        ABSL_LOG(FATAL) << "Saw json_name: "
                        << field_descriptor_proto.has_json_name();
      } else if (command == "Annotate") {
        annotate = true;
      } else if (command == "ShowVersionNumber") {
        Version compiler_version;
        context->GetCompilerVersion(&compiler_version);
        ABSL_LOG(FATAL) << "Saw compiler_version: "
                        << compiler_version.major() * 1000000 +
                               compiler_version.minor() * 1000 +
                               compiler_version.patch()
                        << " " << compiler_version.suffix();
      } else {
        ABSL_LOG(FATAL) << "Unknown MockCodeGenerator command: " << command;
      }
    }
  }

  bool insert_endlines = absl::StartsWith(parameter, "insert_endlines=");
  if (insert_endlines || absl::StartsWith(parameter, "insert=")) {
    std::vector<std::string> insert_into = absl::StrSplit(
        absl::StripPrefix(parameter,
                          insert_endlines ? "insert_endlines=" : "insert="),
        ',', absl::SkipEmpty());

    for (size_t i = 0; i < insert_into.size(); i++) {
      {
        google::protobuf::GeneratedCodeInfo info;
        std::string content =
            GetOutputFileContent(name_, "first_insert", file, context);
        if (insert_endlines) {
          absl::StrReplaceAll({{",", ",\n"}}, &content);
        }
        if (annotate) {
          auto* annotation = info.add_annotation();
          annotation->set_begin(0);
          annotation->set_end(content.size());
          annotation->set_source_file("first_path");
        }
        std::unique_ptr<io::ZeroCopyOutputStream> output(
            context->OpenForInsertWithGeneratedCodeInfo(
                GetOutputFileName(insert_into[i], file),
                std::string(kFirstInsertionPointName), info));
        io::Printer printer(output.get(), '$');
        printer.PrintRaw(content);
        if (printer.failed()) {
          *error = "MockCodeGenerator detected write error.";
          return false;
        }
      }

      {
        google::protobuf::GeneratedCodeInfo info;
        std::string content =
            GetOutputFileContent(name_, "second_insert", file, context);
        if (insert_endlines) {
          absl::StrReplaceAll({{",", ",\n"}}, &content);
        }
        if (annotate) {
          auto* annotation = info.add_annotation();
          annotation->set_begin(0);
          annotation->set_end(content.size());
          annotation->set_source_file("second_path");
        }
        std::unique_ptr<io::ZeroCopyOutputStream> output(
            context->OpenForInsertWithGeneratedCodeInfo(
                GetOutputFileName(insert_into[i], file),
                std::string(kSecondInsertionPointName), info));
        io::Printer printer(output.get(), '$');
        printer.PrintRaw(content);
        if (printer.failed()) {
          *error = "MockCodeGenerator detected write error.";
          return false;
        }
      }
    }
  } else {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(GetOutputFileName(name_, file)));

    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(output.get(), '$',
                        annotate ? &annotation_collector : nullptr);
    printer.PrintRaw(GetOutputFileContent(name_, parameter, file, context));
    std::string annotate_suffix = "_annotation";
    if (annotate) {
      printer.Print("$p$\n", "p", "first");
      printer.Annotate("p", absl::StrCat("first", annotate_suffix));
    }
    printer.PrintRaw(kFirstInsertionPoint);
    if (annotate) {
      printer.Print("$p$\n", "p", "second");
      printer.Annotate("p", absl::StrCat("second", annotate_suffix));
    }
    printer.PrintRaw(kSecondInsertionPoint);
    if (annotate) {
      printer.Print("$p$\n", "p", "third");
      printer.Annotate("p", absl::StrCat("third", annotate_suffix));
    }

    if (printer.failed()) {
      *error = "MockCodeGenerator detected write error.";
      return false;
    }
    if (annotate) {
      std::unique_ptr<io::ZeroCopyOutputStream> meta_output(context->Open(
          absl::StrCat(GetOutputFileName(name_, file), ".pb.meta")));
      if (!TextFormat::Print(annotations, meta_output.get())) {
        *error = "MockCodeGenerator couldn't write .pb.meta";
        return false;
      }
    }
  }

  return true;
}